

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags extra_flags)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  ImGuiWindow *window;
  int iVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  char title [256];
  char local_138 [264];
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  uVar3 = pIVar4->Flags;
  IVar9 = ImGui::GetContentRegionMax();
  fVar1 = size_arg->y;
  iVar8 = (int)size_arg->x;
  fVar10 = (float)(int)size_arg->x;
  fVar11 = (float)(int)fVar1;
  if ((iVar8 < 1) &&
     (fVar10 = (IVar9.x - ((pIVar4->DC).CursorPos.x - (pIVar4->Pos).x)) + fVar10, fVar10 <= 4.0)) {
    fVar10 = 4.0;
  }
  if ((fVar11 <= 0.0) &&
     (fVar11 = fVar11 + (IVar9.y - ((pIVar4->DC).CursorPos.y - (pIVar4->Pos).y)), fVar11 <= 4.0)) {
    fVar11 = 4.0;
  }
  fVar2 = (pIVar5->Style).ChildBorderSize;
  if (!border) {
    (pIVar5->Style).ChildBorderSize = 0.0;
  }
  IVar9.y = fVar11;
  IVar9.x = fVar10;
  if (name == (char *)0x0) {
    ImFormatString(local_138,0x100,"%s/%08X",pIVar4->Name,(ulong)id);
  }
  else {
    ImFormatString(local_138,0x100,"%s/%s",pIVar4->Name,name);
  }
  pIVar6 = GImGui;
  (GImGui->NextWindowData).SizeVal = IVar9;
  (pIVar6->NextWindowData).SizeCond = 1;
  bVar7 = ImGui::Begin(local_138,(bool *)0x0,uVar3 & 4 | extra_flags | 0x1000103);
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  pIVar4->ChildId = id;
  pIVar4->AutoFitChildAxises = (uint)(iVar8 == 0) + (uint)((int)fVar1 == 0) * 2;
  (pIVar5->Style).ChildBorderSize = fVar2;
  if ((((uint)extra_flags >> 0x17 & 1) == 0) &&
     ((((pIVar4->DC).NavLayerActiveMask != 0 || ((pIVar4->DC).NavHasScroll == true)) &&
      (pIVar5->NavActivateId == id)))) {
    ImGui::FocusWindow(pIVar4);
    ImGui::NavInitWindow(pIVar4,false);
    ImGui::SetActiveID(id + 1,pIVar4);
    pIVar5->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar7;
}

Assistant:

static bool BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = ImGui::GetCurrentWindow();
    ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    const ImVec2 content_avail = ImGui::GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    flags |= extra_flags;

    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s", parent_window->Name, name);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    ImGui::SetNextWindowSize(size);
    bool ret = ImGui::Begin(title, NULL, flags);
    ImGuiWindow* child_window = ImGui::GetCurrentWindow();
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = auto_fit_axises;
    g.Style.ChildBorderSize = backup_border_size;

    // Process navigation-in immediately so NavInit can run on first frame
    if (!(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll) && g.NavActivateId == id)
    {
        ImGui::FocusWindow(child_window);
        ImGui::NavInitWindow(child_window, false);
        ImGui::SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }

    return ret;
}